

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetTimeRequestReturnCallback
               (HelicsFederate fed,_func_void_HelicsTime_HelicsBool_void_ptr *requestTimeReturn,
               void *userdata,HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_RSI;
  Federate *fedptr;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffff70;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x0) {
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
                (in_stack_ffffffffffffff60);
      helics::Federate::setTimeRequestReturnCallback
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::~function
                ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x1bd7d6);
    }
    else {
      std::function<void(TimeRepresentation<count_time<9,long>>,bool)>::
      function<helicsFederateSetTimeRequestReturnCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_45541de0 *)in_stack_ffffffffffffff68);
      helics::Federate::setTimeRequestReturnCallback(in_RDX,in_RSI);
      std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::~function
                ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x1bd849);
    }
  }
  return;
}

Assistant:

void helicsFederateSetTimeRequestReturnCallback(HelicsFederate fed,
                                                void (*requestTimeReturn)(HelicsTime newTime, HelicsBool iterating, void* userdata),
                                                void* userdata,
                                                HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (requestTimeReturn == nullptr) {
            fedptr->setTimeRequestReturnCallback({});
        } else {
            fedptr->setTimeRequestReturnCallback([requestTimeReturn, userdata](helics::Time newTime, bool iterating) {
                requestTimeReturn(newTime, (iterating) ? HELICS_TRUE : HELICS_FALSE, userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}